

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O2

void __thiscall
mjs::date_object::do_debug_print_extra
          (date_object *this,wostream *os,int param_2,int param_3,int indent)

{
  wostream *pwVar1;
  char buffer [32];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  builtin_strncpy(buffer,"Invalid Date",0xd);
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  if (!NAN(this->value_)) {
    snprintf(buffer,0x20,"%.17g");
  }
  local_38[0] = local_28;
  std::__cxx11::wstring::_M_construct((ulong)local_38,indent);
  pwVar1 = std::operator<<(os,(wstring *)local_38);
  pwVar1 = std::operator<<(pwVar1,"[[Value]]: ");
  pwVar1 = std::operator<<(pwVar1,buffer);
  std::operator<<(pwVar1,"\n");
  std::__cxx11::wstring::~wstring((wstring *)local_38);
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        char buffer[32] = "Invalid Date";
        if (!std::isnan(value_)) {
            std::snprintf(buffer, sizeof(buffer), "%.17g", value_);
        }
        os << std::wstring(indent, ' ') << "[[Value]]: " << buffer << "\n";
    }